

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_update_de_30
               (secp256k1_modinv32_signed30 *d,secp256k1_modinv32_signed30 *e,
               secp256k1_modinv32_trans2x2 *t,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar4;
  secp256k1_modinv32_signed30 *psVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int32_t *piVar12;
  secp256k1_modinv32_signed30 *b;
  ulong uVar13;
  long *extraout_RDX;
  secp256k1_modinv32_signed30 *psVar14;
  secp256k1_fe *psVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  secp256k1_fe *psVar21;
  ulong uVar22;
  secp256k1_fe *psVar23;
  secp256k1_fe *r;
  secp256k1_modinv32_signed30 *a_00;
  long lVar24;
  ulong uVar25;
  secp256k1_fe *r_00;
  uchar *__s;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  uint uVar31;
  secp256k1_modinv32_modinfo *psVar32;
  code *pcVar33;
  uint uVar34;
  secp256k1_modinv32_modinfo *psVar35;
  size_t count;
  uint uVar36;
  code *pcVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong uStack_12b8;
  secp256k1_fe *psStack_12b0;
  uchar auStack_12a8 [4232];
  secp256k1_fe *psStack_220;
  code *pcStack_218;
  undefined8 uStack_210;
  secp256k1_fe *psStack_208;
  code *pcStack_200;
  code *pcStack_1f8;
  undefined1 auStack_1f0 [36];
  int iStack_1cc;
  int iStack_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int iStack_1b8;
  int iStack_1b4;
  undefined1 auStack_1b0 [48];
  code *pcStack_180;
  secp256k1_fe sStack_178;
  secp256k1_fe sStack_148;
  secp256k1_fe sStack_118;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  secp256k1_modinv32_signed30 *psStack_c8;
  ulong uStack_c0;
  code *pcStack_b8;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  secp256k1_modinv32_signed30 *psStack_98;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  int32_t iStack_7c;
  secp256k1_modinv32_signed30 *psStack_78;
  secp256k1_modinv32_modinfo *psStack_70;
  secp256k1_modinv32_modinfo *psStack_68;
  secp256k1_modinv32_signed30 *psStack_60;
  secp256k1_modinv32_signed30 *psStack_58;
  code *pcStack_50;
  long local_40;
  long local_38;
  
  uVar19 = t->u;
  psVar35 = (secp256k1_modinv32_modinfo *)(long)(int)uVar19;
  uVar11 = t->v;
  lVar16 = (long)(int)uVar11;
  uVar20 = t->q;
  psVar14 = (secp256k1_modinv32_signed30 *)(long)(int)uVar20;
  local_40 = (long)t->r;
  psVar21 = (secp256k1_fe *)0x9;
  pcStack_50 = (code *)0x14baa9;
  a_00 = d;
  iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
  if (iVar1 < 1) {
    pcStack_50 = (code *)0x14bd11;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bd11:
    pcStack_50 = (code *)0x14bd16;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bd16:
    pcStack_50 = (code *)0x14bd1b;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bd1b:
    pcStack_50 = (code *)0x14bd20;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bd20:
    pcStack_50 = (code *)0x14bd25;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bd25:
    pcStack_50 = (code *)0x14bd2a;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bd2a:
    pcStack_50 = (code *)0x14bd2f;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bd2f:
    pcStack_50 = (code *)0x14bd34;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar32 = modinfo;
LAB_0014bd34:
    pcStack_50 = (code *)0x14bd39;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bd39:
    pcStack_50 = (code *)0x14bd3e;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bd3e:
    pcStack_50 = (code *)0x14bd43;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bac6;
    a_00 = d;
    iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014bd11;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bae3;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar1 < 1) goto LAB_0014bd16;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bb00;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014bd1b;
    psVar32 = (secp256k1_modinv32_modinfo *)-(long)psVar35;
    if (0 < (long)psVar35) {
      psVar32 = psVar35;
    }
    lVar6 = -lVar16;
    if (lVar16 < 1) {
      lVar6 = lVar16;
    }
    if (lVar6 + 0x40000000 < (long)psVar32) goto LAB_0014bd20;
    psVar5 = (secp256k1_modinv32_signed30 *)-(long)psVar14;
    if (0 < (long)psVar14) {
      psVar5 = psVar14;
    }
    lVar6 = -local_40;
    if (local_40 < 1) {
      lVar6 = local_40;
    }
    if (lVar6 + 0x40000000 < (long)psVar5) goto LAB_0014bd25;
    uVar26 = d->v[8] >> 0x1f;
    uVar18 = e->v[8] >> 0x1f;
    psVar21 = (secp256k1_fe *)(ulong)uVar18;
    iVar1 = (uVar18 & uVar11) + (uVar26 & uVar19);
    a_00 = (secp256k1_modinv32_signed30 *)(e->v[0] * lVar16 + (long)d->v[0] * (long)psVar35);
    lVar6 = (long)(modinfo->modulus).v[0];
    lVar9 = (long)(int)(iVar1 - ((int)a_00 * modinfo->modulus_inv30 + iVar1 & 0x3fffffff));
    piVar12 = (int32_t *)((long)a_00->v + lVar9 * lVar6);
    if (((ulong)piVar12 & 0x3fffffff) != 0) goto LAB_0014bd2a;
    iVar1 = (uVar18 & (uint)local_40) + (uVar26 & uVar20);
    lVar30 = e->v[0] * local_40 + (long)d->v[0] * (long)psVar14;
    a_00 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar19 = iVar1 - (modinfo->modulus_inv30 * (int)lVar30 + iVar1 & 0x3fffffff);
    psVar21 = (secp256k1_fe *)(ulong)uVar19;
    uVar7 = lVar6 * (int)uVar19 + lVar30;
    local_38 = lVar9;
    if ((uVar7 & 0x3fffffff) != 0) goto LAB_0014bd2f;
    lVar6 = (long)uVar7 >> 0x1e;
    lVar30 = (long)piVar12 >> 0x1e;
    lVar24 = 1;
    do {
      lVar8 = (long)(modinfo->modulus).v[lVar24];
      lVar30 = lVar8 * lVar9 + e->v[lVar24] * lVar16 + (long)d->v[lVar24] * (long)psVar35 + lVar30;
      psVar32 = (secp256k1_modinv32_modinfo *)(e->v[lVar24] * local_40);
      lVar6 = (long)(psVar32->modulus).v +
              (long)d->v[lVar24] * (long)psVar14 + lVar6 + lVar8 * (int)uVar19;
      d->v[lVar24 + -1] = (uint)lVar30 & 0x3fffffff;
      e->v[lVar24 + -1] = (uint)lVar6 & 0x3fffffff;
      lVar24 = lVar24 + 1;
      lVar6 = lVar6 >> 0x1e;
      lVar30 = lVar30 >> 0x1e;
    } while (lVar24 != 9);
    d->v[8] = (int32_t)lVar30;
    e->v[8] = (int32_t)lVar6;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bcaa;
    a_00 = d;
    iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,-2);
    psVar14 = e;
    psVar35 = modinfo;
    if (iVar1 < 1) goto LAB_0014bd34;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bcc7;
    a_00 = d;
    iVar1 = secp256k1_modinv32_mul_cmp_30(d,9,&modinfo->modulus,1);
    if (-1 < iVar1) goto LAB_0014bd39;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bce0;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,-2);
    if (iVar1 < 1) goto LAB_0014bd3e;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_50 = (code *)0x14bcf9;
    a_00 = e;
    iVar1 = secp256k1_modinv32_mul_cmp_30(e,9,&modinfo->modulus,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_50 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  uVar19 = a_00->v[0];
  uVar25 = (ulong)uVar19;
  uVar11 = a_00->v[3];
  uVar22 = (ulong)uVar11;
  uVar20 = a_00->v[4];
  uVar17 = (ulong)uVar20;
  uVar18 = a_00->v[5];
  uVar13 = (ulong)uVar18;
  psVar5 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_00->v[6];
  uVar26 = a_00->v[7];
  uVar7 = (ulong)uVar26;
  iStack_7c = a_00->v[8];
  lVar6 = 0;
  do {
    psStack_78 = psVar14;
    psStack_70 = psVar32;
    psStack_68 = psVar35;
    psStack_60 = e;
    psStack_58 = d;
    pcStack_50 = (code *)lVar16;
    if (a_00->v[lVar6] < -0x3fffffff) {
      pcStack_b8 = (code *)0x14c091;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014c091:
      pcStack_b8 = (code *)0x14c096;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014c096;
    }
    if (0x3fffffff < a_00->v[lVar6]) goto LAB_0014c091;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 9);
  uStack_9c = (uint)psVar21;
  psVar21 = (secp256k1_fe *)0x9;
  pcStack_b8 = (code *)0x14bdce;
  psVar5 = a_00;
  uStack_a8 = a_00->v[1];
  uStack_a4 = a_00->v[2];
  uStack_a0 = a_00->v[6];
  psStack_98 = b;
  iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,b,-2);
  if (iVar1 < 1) {
LAB_0014c096:
    pcStack_b8 = (code *)0x14c09b;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014c09b:
    pcStack_b8 = (code *)0x14c0a0;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014c0a0:
    pcStack_b8 = (code *)0x14c0a5;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014c0a5:
    pcStack_b8 = (code *)0x14c0aa;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x14bded;
    psVar5 = a_00;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,1);
    if (-1 < iVar1) goto LAB_0014c09b;
    uVar2 = iStack_7c >> 0x1f;
    uStack_80 = psStack_98->v[1];
    uVar3 = (uVar2 & uStack_80) + uStack_a8;
    uStack_a8 = psStack_98->v[2];
    uVar10 = (uVar2 & uStack_a8) + uStack_a4;
    uStack_a4 = psStack_98->v[3];
    uStack_84 = psStack_98->v[4];
    uStack_88 = psStack_98->v[5];
    uStack_8c = psStack_98->v[6];
    uVar34 = (uVar2 & uStack_8c) + uStack_a0;
    uStack_a0 = psStack_98->v[7];
    uStack_ac = (int)uStack_9c >> 0x1f;
    uStack_9c = psStack_98->v[8];
    uVar29 = ((uVar2 & psStack_98->v[0]) + uVar19 ^ uStack_ac) - uStack_ac;
    uVar27 = ((int)uVar29 >> 0x1e) + ((uVar3 ^ uStack_ac) - uStack_ac);
    uVar3 = ((int)uVar27 >> 0x1e) + ((uVar10 ^ uStack_ac) - uStack_ac);
    uVar36 = ((int)uVar3 >> 0x1e) + (((uVar2 & uStack_a4) + uVar11 ^ uStack_ac) - uStack_ac);
    uVar11 = ((int)uVar36 >> 0x1e) + (((uVar2 & uStack_84) + uVar20 ^ uStack_ac) - uStack_ac);
    uVar19 = ((int)uVar11 >> 0x1e) + (((uVar2 & uStack_88) + uVar18 ^ uStack_ac) - uStack_ac);
    uVar20 = ((int)uVar19 >> 0x1e) + ((uVar34 ^ uStack_ac) - uStack_ac);
    uVar18 = ((int)uVar20 >> 0x1e) + (((uVar2 & uStack_a0) + uVar26 ^ uStack_ac) - uStack_ac);
    uVar31 = ((int)uVar18 >> 0x1e) + (((uVar2 & uStack_9c) + iStack_7c ^ uStack_ac) - uStack_ac);
    uVar13 = (ulong)uVar31;
    uStack_b0 = (int)uVar31 >> 0x1f;
    uVar34 = (psStack_98->v[0] & uStack_b0) + (uVar29 & 0x3fffffff);
    uVar10 = (uStack_88 & uStack_b0) + (uVar19 & 0x3fffffff);
    uVar25 = (ulong)uVar10;
    uVar29 = (uStack_8c & uStack_b0) + (uVar20 & 0x3fffffff);
    uVar22 = (ulong)uVar29;
    uVar19 = ((int)uVar34 >> 0x1e) + (uStack_80 & uStack_b0) + (uVar27 & 0x3fffffff);
    uVar20 = ((int)uVar19 >> 0x1e) + (uStack_a8 & uStack_b0) + (uVar3 & 0x3fffffff);
    uVar26 = ((int)uVar20 >> 0x1e) + (uStack_a4 & uStack_b0) + (uVar36 & 0x3fffffff);
    uVar2 = ((int)uVar26 >> 0x1e) + (uStack_84 & uStack_b0) + (uVar11 & 0x3fffffff);
    uVar10 = ((int)uVar2 >> 0x1e) + uVar10;
    uVar29 = ((int)uVar10 >> 0x1e) + uVar29;
    uVar11 = ((int)uVar29 >> 0x1e) + (uStack_a0 & uStack_b0) + (uVar18 & 0x3fffffff);
    uVar18 = ((int)uVar11 >> 0x1e) + (uStack_9c & uStack_b0) + uVar31;
    uVar17 = (ulong)uVar18;
    uVar26 = uVar26 & 0x3fffffff;
    psVar21 = (secp256k1_fe *)(ulong)uVar26;
    uVar2 = uVar2 & 0x3fffffff;
    psVar5 = (secp256k1_modinv32_signed30 *)(ulong)uVar2;
    uVar11 = uVar11 & 0x3fffffff;
    uVar7 = (ulong)uVar11;
    a_00->v[0] = uVar34 & 0x3fffffff;
    a_00->v[1] = uVar19 & 0x3fffffff;
    a_00->v[2] = uVar20 & 0x3fffffff;
    a_00->v[3] = uVar26;
    a_00->v[4] = uVar2;
    a_00->v[5] = uVar10 & 0x3fffffff;
    a_00->v[6] = uVar29 & 0x3fffffff;
    a_00->v[7] = uVar11;
    a_00->v[8] = uVar18;
    if (0x3fffffff < uVar18) goto LAB_0014c0a0;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x14c05e;
    psVar5 = a_00;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,0);
    if (iVar1 < 0) goto LAB_0014c0a5;
    psVar21 = (secp256k1_fe *)0x9;
    pcStack_b8 = (code *)0x14c079;
    psVar5 = a_00;
    iVar1 = secp256k1_modinv32_mul_cmp_30(a_00,9,psStack_98,1);
    if (iVar1 < 0) {
      return;
    }
  }
  pcStack_b8 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_178;
  psVar15 = &sStack_178;
  pcVar33 = secp256k1_fe_inv_var;
  if (extraout_EDX == 0) {
    pcVar33 = secp256k1_fe_inv;
  }
  pcStack_180 = (code *)0x14c0e0;
  uStack_e0 = uVar7;
  uStack_d8 = uVar13;
  uStack_d0 = uVar22;
  psStack_c8 = a_00;
  uStack_c0 = uVar25;
  pcStack_b8 = (code *)uVar17;
  (*pcVar33)(&sStack_178);
  if (psVar5 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar5->v + 8) = sStack_178.n[4];
    *(ulong *)(psVar5[1].v + 1) = CONCAT44(sStack_178.normalized,sStack_178.magnitude);
    *(uint64_t *)(psVar5->v + 4) = sStack_178.n[2];
    *(uint64_t *)(psVar5->v + 6) = sStack_178.n[3];
    *(uint64_t *)psVar5->v = sStack_178.n[0];
    *(uint64_t *)(psVar5->v + 2) = sStack_178.n[1];
  }
  uVar17 = 0xffffffffffff;
  sStack_118.n[0] = psVar21->n[0];
  sStack_118.n[1] = psVar21->n[1];
  sStack_118.n[2] = psVar21->n[2];
  sStack_118.n[3] = psVar21->n[3];
  sStack_118.n[4] = psVar21->n[4];
  sStack_118.magnitude = psVar21->magnitude;
  sStack_118.normalized = psVar21->normalized;
  psVar23 = &sStack_118;
  pcStack_180 = (code *)0x14c149;
  secp256k1_fe_verify(psVar23);
  uVar7 = (sStack_118.n[4] >> 0x30) * 0x1000003d1 + sStack_118.n[0];
  if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
    uVar13 = (uVar7 >> 0x34) + sStack_118.n[1];
    uVar22 = (uVar13 >> 0x34) + sStack_118.n[2];
    uVar25 = (uVar22 >> 0x34) + sStack_118.n[3];
    uVar28 = (uVar25 >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
    if ((((uVar13 | uVar7 | uVar22 | uVar25) & 0xfffffffffffff) != 0 || uVar28 != 0) &&
       (((uVar7 | 0x1000003d0) & uVar13 & uVar22 & uVar25 & (uVar28 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c1f0;
LAB_0014c5ba:
    pcStack_180 = (code *)0x14c5c5;
    secp256k1_fe_verify(&sStack_178);
    uVar17 = sStack_178.n[4] & 0xffffffffffff;
    uVar7 = (sStack_178.n[4] >> 0x30) * 0x1000003d1 + sStack_178.n[0];
    uVar13 = (uVar7 >> 0x34) + sStack_178.n[1];
    uVar22 = (uVar13 >> 0x34) + sStack_178.n[2];
    r = (secp256k1_fe *)((uVar22 >> 0x34) + sStack_178.n[3]);
    uVar25 = ((ulong)r >> 0x34) + uVar17;
    if ((((uVar13 | uVar7 | uVar22 | (ulong)r) & 0xfffffffffffff) == 0 && uVar25 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar25 ^ 0xf000000000000), psVar15 = &sStack_178,
       ((uVar7 ^ 0x1000003d0) & uVar13 & uVar22 & (ulong)r & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0014c1f0:
    pcStack_180 = (code *)0x14c203;
    psVar23 = psVar21;
    secp256k1_fe_mul(&sStack_118,psVar21,&sStack_178);
    pcStack_180 = (code *)0x14c20b;
    secp256k1_fe_verify(&sStack_118);
    r_00 = &fe_minus_one;
    pcStack_180 = (code *)0x14c217;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_118.magnitude < 0x20) {
      sStack_118.n[0] = sStack_118.n[0] + 0xffffefffffc2e;
      sStack_118.n[1] = sStack_118.n[1] + 0xfffffffffffff;
      sStack_118.n[2] = sStack_118.n[2] + 0xfffffffffffff;
      sStack_118.n[3] = sStack_118.n[3] + 0xfffffffffffff;
      sStack_118.n[4] = sStack_118.n[4] + 0xffffffffffff;
      sStack_118.normalized = 0;
      sStack_118.magnitude = sStack_118.magnitude + 1;
      pcStack_180 = (code *)0x14c269;
      secp256k1_fe_verify(&sStack_118);
      pcStack_180 = (code *)0x14c271;
      secp256k1_fe_verify(&sStack_118);
      uVar7 = (sStack_118.n[4] >> 0x30) * 0x1000003d1 + sStack_118.n[0];
      uVar13 = (uVar7 >> 0x34) + sStack_118.n[1];
      uVar22 = (uVar13 >> 0x34) + sStack_118.n[2];
      psVar23 = (secp256k1_fe *)((uVar22 >> 0x34) + sStack_118.n[3]);
      uVar25 = ((ulong)psVar23 >> 0x34) + (sStack_118.n[4] & 0xffffffffffff);
      if ((((uVar13 | uVar7 | uVar22 | (ulong)psVar23) & 0xfffffffffffff) != 0 || uVar25 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar25 ^ 0xf000000000000),
         ((uVar7 ^ 0x1000003d0) & uVar13 & uVar22 & (ulong)psVar23 & (ulong)r_00) != 0xfffffffffffff
         )) goto LAB_0014c658;
      sStack_148.n[0] = psVar21->n[0];
      sStack_148.n[1] = psVar21->n[1];
      sStack_148.n[2] = psVar21->n[2];
      sStack_148.n[3] = psVar21->n[3];
      sStack_148.n[4] = psVar21->n[4];
      sStack_148.magnitude = psVar21->magnitude;
      sStack_148.normalized = psVar21->normalized;
      psVar21 = &sStack_148;
      pcStack_180 = (code *)0x14c317;
      secp256k1_fe_verify(psVar21);
      r_00 = &fe_minus_one;
      pcStack_180 = (code *)0x14c323;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_148.magnitude) goto LAB_0014c65d;
      sStack_148.n[0] = sStack_148.n[0] + 0xffffefffffc2e;
      sStack_148.n[1] = sStack_148.n[1] + 0xfffffffffffff;
      sStack_148.n[2] = sStack_148.n[2] + 0xfffffffffffff;
      sStack_148.n[3] = sStack_148.n[3] + 0xfffffffffffff;
      sStack_148.n[4] = sStack_148.n[4] + 0xffffffffffff;
      sStack_148.normalized = 0;
      sStack_148.magnitude = sStack_148.magnitude + 1;
      pcStack_180 = (code *)0x14c36e;
      secp256k1_fe_verify(&sStack_148);
      pcStack_180 = (code *)0x14c376;
      secp256k1_fe_verify(&sStack_148);
      uVar7 = (sStack_148.n[4] >> 0x30) * 0x1000003d1 + sStack_148.n[0];
      if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
        uVar13 = (uVar7 >> 0x34) + sStack_148.n[1];
        uVar22 = (uVar13 >> 0x34) + sStack_148.n[2];
        uVar25 = (uVar22 >> 0x34) + sStack_148.n[3];
        uVar28 = (uVar25 >> 0x34) + (sStack_148.n[4] & 0xffffffffffff);
        if (((uVar13 | uVar7 | uVar22 | uVar25) & 0xfffffffffffff) == 0 && uVar28 == 0) {
          return;
        }
        if (((uVar7 | 0x1000003d0) & uVar13 & uVar22 & uVar25 & (uVar28 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar23 = &sStack_148;
      pcStack_180 = (code *)0x14c425;
      (*pcVar33)();
      pcStack_180 = (code *)0x14c430;
      secp256k1_fe_verify(&sStack_178);
      r_00 = &fe_minus_one;
      pcStack_180 = (code *)0x14c43c;
      secp256k1_fe_verify(&fe_minus_one);
      psVar21 = &sStack_178;
      if (0x1f < sStack_178.magnitude) goto LAB_0014c662;
      sStack_178.n[0] = sStack_178.n[0] + 0xffffefffffc2e;
      sStack_178.n[1] = sStack_178.n[1] + 0xfffffffffffff;
      sStack_178.n[2] = sStack_178.n[2] + 0xfffffffffffff;
      sStack_178.n[3] = sStack_178.n[3] + 0xfffffffffffff;
      sStack_178.n[4] = sStack_178.n[4] + 0xffffffffffff;
      sStack_178.magnitude = sStack_178.magnitude + 1;
      sStack_178.normalized = 0;
      pcStack_180 = (code *)0x14c485;
      secp256k1_fe_verify(&sStack_178);
      pcStack_180 = (code *)0x14c48e;
      (*pcVar33)(&sStack_178);
      pcStack_180 = (code *)0x14c496;
      secp256k1_fe_verify(&sStack_178);
      sStack_178.n[0] = sStack_178.n[0] + 1;
      sStack_178.magnitude = sStack_178.magnitude + 1;
      sStack_178.normalized = 0;
      pcStack_180 = (code *)0x14c4a8;
      secp256k1_fe_verify(&sStack_178);
      pcStack_180 = (code *)0x14c4b0;
      secp256k1_fe_verify(&sStack_178);
      psVar23 = &sStack_148;
      pcStack_180 = (code *)0x14c4bd;
      r_00 = psVar23;
      secp256k1_fe_verify(psVar23);
      if (sStack_148.magnitude + sStack_178.magnitude < 0x21) {
        sStack_178.n[0] = sStack_178.n[0] + sStack_148.n[0];
        sStack_178.n[1] = sStack_178.n[1] + sStack_148.n[1];
        sStack_178.n[2] = sStack_178.n[2] + sStack_148.n[2];
        sStack_178.n[3] = sStack_178.n[3] + sStack_148.n[3];
        sStack_178.n[4] = sStack_178.n[4] + sStack_148.n[4];
        sStack_178.normalized = 0;
        pcStack_180 = (code *)0x14c509;
        sStack_178.magnitude = sStack_148.magnitude + sStack_178.magnitude;
        secp256k1_fe_verify(&sStack_178);
        pcStack_180 = (code *)0x14c511;
        secp256k1_fe_verify(&sStack_178);
        uVar7 = (sStack_178.n[4] >> 0x30) * 0x1000003d1 + sStack_178.n[0];
        if (((uVar7 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar7 & 0xfffffffffffff) == 0)) {
          uVar17 = (uVar7 >> 0x34) + sStack_178.n[1];
          uVar13 = (uVar17 >> 0x34) + sStack_178.n[2];
          uVar22 = (uVar13 >> 0x34) + sStack_178.n[3];
          uVar25 = (uVar22 >> 0x34) + (sStack_178.n[4] & 0xffffffffffff);
          if (((uVar17 | uVar7 | uVar13 | uVar22) & 0xfffffffffffff) == 0 && uVar25 == 0) {
            return;
          }
          if (((uVar7 | 0x1000003d0) & uVar17 & uVar13 & uVar22 & (uVar25 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_180 = (code *)0x14c5ba;
        test_inverse_field_cold_2();
        goto LAB_0014c5ba;
      }
    }
    else {
      pcStack_180 = (code *)0x14c658;
      test_inverse_field_cold_7();
LAB_0014c658:
      pcStack_180 = (code *)0x14c65d;
      test_inverse_field_cold_6();
LAB_0014c65d:
      pcStack_180 = (code *)0x14c662;
      test_inverse_field_cold_5();
LAB_0014c662:
      r = psVar23;
      psVar15 = psVar21;
      psVar23 = &sStack_118;
      pcStack_180 = (code *)0x14c667;
      test_inverse_field_cold_4();
    }
    pcStack_180 = (code *)0x14c66c;
    test_inverse_field_cold_3();
  }
  pcStack_180 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_180 = (code *)0xfffffffffffff;
  psVar21 = (secp256k1_fe *)auStack_1f0;
  pcVar37 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_00 == 0) {
    pcVar37 = secp256k1_scalar_inverse;
  }
  pcStack_1f8 = (code *)0x14c69a;
  auStack_1b0._32_8_ = psVar15;
  auStack_1b0._40_8_ = psVar23;
  (*pcVar37)(auStack_1f0);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_1f0._20_4_,auStack_1f0._16_4_);
    r_00->n[3] = CONCAT44(auStack_1f0._28_4_,auStack_1f0._24_4_);
    r_00->n[0] = CONCAT44(auStack_1f0._4_4_,auStack_1f0._0_4_);
    r_00->n[1] = CONCAT44(auStack_1f0._12_4_,auStack_1f0._8_4_);
  }
  pcStack_1f8 = (code *)0x14c6b9;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar38._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar38._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar38._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar38._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar38);
  if (iVar1 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_1b0;
    pcStack_1f8 = (code *)0x14c6ed;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_1f0);
    pcStack_1f8 = (code *)0x14c6f5;
    psVar15 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_1b0._0_8_ != 1 || auStack_1b0._8_8_ != 0) || auStack_1b0._16_8_ != 0) ||
        auStack_1b0._24_8_ != 0) {
      pcStack_1f8 = (code *)0x14c7ff;
      test_inverse_scalar_cold_1();
      goto LAB_0014c7ff;
    }
    pcStack_1f8 = (code *)0x14c725;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_1f0 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_1f8 = (code *)0x14c72d;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1f0 + 0x20));
    auVar39._0_4_ = -(uint)(iStack_1c0 == 0 && auStack_1f0._32_4_ == 0);
    auVar39._4_4_ = -(uint)(iStack_1bc == 0 && iStack_1cc == 0);
    auVar39._8_4_ = -(uint)(iStack_1b8 == 0 && iStack_1c8 == 0);
    auVar39._12_4_ = -(uint)(iStack_1b4 == 0 && iStack_1c4 == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar39);
    if (iVar1 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_1f0 + 0x20);
    pcStack_1f8 = (code *)0x14c75e;
    (*pcVar37)(a,a);
    pcStack_1f8 = (code *)0x14c773;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1f0,&scalar_minus_one,(secp256k1_scalar *)auStack_1f0);
    pcStack_1f8 = (code *)0x14c77c;
    (*pcVar37)(auStack_1f0,auStack_1f0);
    pcStack_1f8 = (code *)0x14c78e;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1f0,(secp256k1_scalar *)auStack_1f0,&secp256k1_scalar_one
              );
    pcStack_1f8 = (code *)0x14c79c;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_1f0,a,(secp256k1_scalar *)auStack_1f0);
    pcStack_1f8 = (code *)0x14c7a4;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1f0);
    auVar40._0_4_ = -(uint)(auStack_1f0._16_4_ == 0 && auStack_1f0._0_4_ == 0);
    auVar40._4_4_ = -(uint)(auStack_1f0._20_4_ == 0 && auStack_1f0._4_4_ == 0);
    auVar40._8_4_ = -(uint)(auStack_1f0._24_4_ == 0 && auStack_1f0._8_4_ == 0);
    auVar40._12_4_ = -(uint)(auStack_1f0._28_4_ == 0 && auStack_1f0._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar40);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_1f8 = (code *)0x14c7c8;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_1f0;
  }
  pcStack_1f8 = (code *)0x14c7d3;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_1f0);
  auVar41._0_4_ = -(uint)(auStack_1f0._16_4_ == 0 && auStack_1f0._0_4_ == 0);
  auVar41._4_4_ = -(uint)(auStack_1f0._20_4_ == 0 && auStack_1f0._4_4_ == 0);
  auVar41._8_4_ = -(uint)(auStack_1f0._24_4_ == 0 && auStack_1f0._8_4_ == 0);
  auVar41._12_4_ = -(uint)(auStack_1f0._28_4_ == 0 && auStack_1f0._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar41);
  r = (secp256k1_fe *)auStack_1f0;
  psVar15 = psVar21;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0014c7ff:
  pcStack_1f8 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_210 = 0x1000003d1;
  __s = auStack_12a8;
  psStack_220 = r;
  pcStack_218 = pcVar33;
  psStack_208 = r_00;
  pcStack_200 = pcVar37;
  pcStack_1f8 = (code *)uVar17;
  memset(__s,0,0x1081);
  uStack_12b8 = 0;
  lVar16 = 0x41;
  psStack_12b0 = psVar15;
  secp256k1_hsort(__s,0x41,(size_t)psVar15,test_hsort_cmp,&uStack_12b8);
  if (0x3f < uStack_12b8) {
    test_hsort_is_sorted(auStack_12a8,0x41,(size_t)psVar15);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar4 = testrand_int(0x41);
        count = (size_t)(int)uVar4;
        testrand_bytes_test(auStack_12a8,count * (long)psVar15);
        secp256k1_hsort(auStack_12a8,count,(size_t)psVar15,test_hsort_cmp,&uStack_12b8);
        test_hsort_is_sorted(auStack_12a8,count,(size_t)psVar15);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar6 = 0;
    do {
      if (__s[lVar6] != *(uchar *)(lVar16 + lVar6)) {
        return;
      }
      lVar6 = lVar6 + 1;
    } while (extraout_RDX[1] != lVar6);
  }
  return;
}

Assistant:

static void secp256k1_modinv32_update_de_30(secp256k1_modinv32_signed30 *d, secp256k1_modinv32_signed30 *e, const secp256k1_modinv32_trans2x2 *t, const secp256k1_modinv32_modinfo* modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    const int32_t u = t->u, v = t->v, q = t->q, r = t->r;
    int32_t di, ei, md, me, sd, se;
    int64_t cd, ce;
    int i;
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(labs(u) <= (M30 + 1 - labs(v))); /* |u|+|v| <= 2^30 */
    VERIFY_CHECK(labs(q) <= (M30 + 1 - labs(r))); /* |q|+|r| <= 2^30 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d->v[8] >> 31;
    se = e->v[8] >> 31;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    di = d->v[0];
    ei = e->v[0];
    cd = (int64_t)u * di + (int64_t)v * ei;
    ce = (int64_t)q * di + (int64_t)r * ei;
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 30 zero bottom bits. */
    md -= (modinfo->modulus_inv30 * (uint32_t)cd + md) & M30;
    me -= (modinfo->modulus_inv30 * (uint32_t)ce + me) & M30;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    cd += (int64_t)modinfo->modulus.v[0] * md;
    ce += (int64_t)modinfo->modulus.v[0] * me;
    /* Verify that the low 30 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK(((int32_t)cd & M30) == 0); cd >>= 30;
    VERIFY_CHECK(((int32_t)ce & M30) == 0); ce >>= 30;
    /* Now iteratively compute limb i=1..8 of t*[d,e]+modulus*[md,me], and store them in output
     * limb i-1 (shifting down by 30 bits). */
    for (i = 1; i < 9; ++i) {
        di = d->v[i];
        ei = e->v[i];
        cd += (int64_t)u * di + (int64_t)v * ei;
        ce += (int64_t)q * di + (int64_t)r * ei;
        cd += (int64_t)modinfo->modulus.v[i] * md;
        ce += (int64_t)modinfo->modulus.v[i] * me;
        d->v[i - 1] = (int32_t)cd & M30; cd >>= 30;
        e->v[i - 1] = (int32_t)ce & M30; ce >>= 30;
    }
    /* What remains is limb 9 of t*[d,e]+modulus*[md,me]; store it as output limb 8. */
    d->v[8] = (int32_t)cd;
    e->v[8] = (int32_t)ce;

    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(d, 9, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(e, 9, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}